

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O3

string_view __thiscall chain::str::trim_right_view(str *this,string_view data)

{
  str *psVar1;
  int iVar2;
  str *psVar3;
  str *psVar4;
  str *psVar5;
  string_view sVar6;
  
  if (this == (str *)0x0) {
    psVar5 = (str *)0x0;
  }
  else {
    psVar5 = this + -1;
    psVar4 = (str *)0xffffffffffffffff;
    if ((long)psVar5 < -1) {
      psVar4 = psVar5;
    }
    do {
      psVar3 = psVar5;
      psVar1 = psVar4;
      if ((long)psVar3 < 0) break;
      iVar2 = isspace((uint)(byte)((char *)data._M_len)[(long)psVar3]);
      psVar5 = psVar3 + -1;
      psVar1 = psVar3;
    } while (iVar2 != 0);
    psVar5 = psVar1 + 1;
    if (this < psVar1 + 1) {
      psVar5 = this;
    }
  }
  sVar6._M_str = (char *)data._M_len;
  sVar6._M_len = (size_t)psVar5;
  return sVar6;
}

Assistant:

auto trim_right_view(std::string_view data) -> std::string_view
{
    if (!data.empty())
    {
        int64_t index = static_cast<int64_t>(data.length() - 1);
        while (index >= 0)
        {
            if (!std::isspace(static_cast<unsigned char>(data[static_cast<std::size_t>(index)])))
            {
                break;
            }
            else
            {
                --index;
            }
        }

        data = data.substr(0, static_cast<std::size_t>(index + 1));
    }

    return data;
}